

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seed.cpp
# Opt level: O0

Seed jbcoin::randomSeed(void)

{
  pointer pvVar1;
  size_type sVar2;
  csprng_engine *g;
  undefined8 extraout_RDX;
  Seed *in_RDI;
  Seed SVar3;
  enable_if_t<std::is_same<unsigned_char,_char>::value____std::is_same<unsigned_char,_unsigned_char>::value,_Slice>
  local_38;
  undefined1 local_21;
  undefined1 local_20 [8];
  array<unsigned_char,_16UL> buffer;
  Seed *seed;
  
  pvVar1 = std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_20);
  sVar2 = std::array<unsigned_char,_16UL>::size((array<unsigned_char,_16UL> *)local_20);
  g = crypto_prng();
  beast::rngfill<jbcoin::csprng_engine>(pvVar1,sVar2,g);
  local_21 = 0;
  local_38 = makeSlice<unsigned_char,16ul>((array<unsigned_char,_16UL> *)local_20);
  Seed::Seed(in_RDI,&local_38);
  pvVar1 = std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_20);
  sVar2 = std::array<unsigned_char,_16UL>::size((array<unsigned_char,_16UL> *)local_20);
  beast::secure_erase<void>(pvVar1,sVar2);
  SVar3.buf_._M_elems[8] = (char)extraout_RDX;
  SVar3.buf_._M_elems[9] = (char)((ulong)extraout_RDX >> 8);
  SVar3.buf_._M_elems[10] = (char)((ulong)extraout_RDX >> 0x10);
  SVar3.buf_._M_elems[0xb] = (char)((ulong)extraout_RDX >> 0x18);
  SVar3.buf_._M_elems[0xc] = (char)((ulong)extraout_RDX >> 0x20);
  SVar3.buf_._M_elems[0xd] = (char)((ulong)extraout_RDX >> 0x28);
  SVar3.buf_._M_elems[0xe] = (char)((ulong)extraout_RDX >> 0x30);
  SVar3.buf_._M_elems[0xf] = (char)((ulong)extraout_RDX >> 0x38);
  SVar3.buf_._M_elems._0_8_ = in_RDI;
  return (Seed)SVar3.buf_._M_elems;
}

Assistant:

Seed
randomSeed()
{
    std::array <std::uint8_t, 16> buffer;
    beast::rngfill (
        buffer.data(),
        buffer.size(),
        crypto_prng());
    Seed seed (makeSlice (buffer));
    beast::secure_erase(buffer.data(), buffer.size());
    return seed;
}